

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O1

void av1_alloc_restoration_struct(AV1_COMMON *cm,RestorationInfo *rsi,int is_uv)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  RestorationUnitInfo *pRVar3;
  int iVar4;
  int plane_h;
  int plane_w;
  undefined8 local_28;
  
  local_28 = in_RAX;
  av1_get_upsampled_plane_size(cm,is_uv,(int *)((long)&local_28 + 4),(int *)&local_28);
  iVar2 = rsi->restoration_unit_size;
  iVar1 = (local_28._4_4_ + (iVar2 >> 1)) / iVar2;
  if (iVar1 < 2) {
    iVar1 = 1;
  }
  iVar2 = ((iVar2 >> 1) + (int)local_28) / iVar2;
  iVar4 = 1;
  if (1 < iVar2) {
    iVar4 = iVar2;
  }
  rsi->num_rest_units = iVar4 * iVar1;
  rsi->horz_units = iVar1;
  rsi->vert_units = iVar4;
  aom_free(rsi->unit_info);
  pRVar3 = (RestorationUnitInfo *)aom_memalign(0x10,(long)rsi->num_rest_units << 6);
  rsi->unit_info = pRVar3;
  if (pRVar3 != (RestorationUnitInfo *)0x0) {
    return;
  }
  aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate rsi->unit_info");
  return;
}

Assistant:

void av1_alloc_restoration_struct(AV1_COMMON *cm, RestorationInfo *rsi,
                                  int is_uv) {
  int plane_w, plane_h;
  av1_get_upsampled_plane_size(cm, is_uv, &plane_w, &plane_h);

  const int unit_size = rsi->restoration_unit_size;
  const int horz_units = av1_lr_count_units(unit_size, plane_w);
  const int vert_units = av1_lr_count_units(unit_size, plane_h);

  rsi->num_rest_units = horz_units * vert_units;
  rsi->horz_units = horz_units;
  rsi->vert_units = vert_units;

  aom_free(rsi->unit_info);
  CHECK_MEM_ERROR(cm, rsi->unit_info,
                  (RestorationUnitInfo *)aom_memalign(
                      16, sizeof(*rsi->unit_info) * rsi->num_rest_units));
}